

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O2

shared_ptr<Token> __thiscall TokenBuffer::tokenAt(TokenBuffer *this,size_t i)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long *plVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  iterator __end1;
  shared_ptr<Token> sVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  element_type *local_38;
  shared_ptr<Token> *token;
  
  _Var2._M_pi = in_RDX;
  local_38 = (element_type *)this;
  while (peVar1 = local_38, *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(i + 0x10) <= in_RDX)
  {
    Tokenizer::currentToken((Tokenizer *)&stack0xffffffffffffffa8);
    std::__cxx11::list<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>::push_back
              ((list<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)i,
               (value_type *)&stack0xffffffffffffffa8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_50);
    Tokenizer::nextToken((Tokenizer *)(local_50 + 1));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
    _Var2._M_pi = extraout_RDX;
  }
  (((_List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)
   &(local_38->value)._M_dataplus)->_M_impl)._M_node.super__List_node_base._M_next =
       (_List_node_base *)0x0;
  (local_38->value)._M_string_length = 0;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&in_RDX->_vptr__Sp_counted_base + 1);
  plVar3 = (long *)i;
  do {
    plVar3 = (long *)*plVar3;
    if (plVar3 == (long *)i) goto LAB_001142ec;
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)(p_Var4 + 0xffffffffffffffff) + 0xf);
  } while (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
  std::__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> *)local_38,
             (__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> *)(plVar3 + 2));
  _Var2._M_pi = extraout_RDX_00;
LAB_001142ec:
  sVar5.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar5.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  return (shared_ptr<Token>)sVar5.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

const std::shared_ptr<Token> TokenBuffer::tokenAt(std::size_t i) noexcept {
  while (this->tokenList.size() <= i) {
    this->tokenList.push_back(this->tokenizer->currentToken());
    this->tokenizer->nextToken();
  }

  std::size_t numWalked = 0;
  std::shared_ptr<Token> token;

  for (const auto & it : this->tokenList) {
    if (numWalked == i) {
      token = it;
      break;
    }
    numWalked++;
  }

  return token;
}